

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void internal_counters_set_lda(int nspin,xc_dimensions *dim)

{
  int *piVar1;
  bool bVar2;
  
  dim->vrho = nspin;
  dim->rho = nspin;
  dim->zk = 1;
  bVar2 = nspin != 1;
  piVar1 = &dim->v2rho2;
  if (!bVar2) {
    piVar1 = &dim->v4rho4;
  }
  *piVar1 = bVar2 + 1 + (uint)bVar2;
  dim->v3rho3 = (uint)bVar2 * 3 + 1;
  piVar1 = &dim->v4rho4;
  if (!bVar2) {
    piVar1 = &dim->v2rho2;
  }
  *piVar1 = (uint)bVar2 * 4 + 1;
  return;
}

Assistant:

void
internal_counters_set_lda(int nspin, xc_dimensions *dim)
{
  dim->rho = dim->vrho = nspin;
  dim->zk  = 1;
  if(nspin == XC_UNPOLARIZED){
    dim->v2rho2 = dim->v3rho3 = dim->v4rho4 = 1;
  }else{
    dim->v2rho2 = 3;
    dim->v3rho3 = 4;
    dim->v4rho4 = 5;
  }
}